

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literal *value)

{
  Type type_00;
  bool bVar1;
  int32_t x;
  Const *pCVar2;
  Expression *pEVar3;
  HeapType HVar4;
  RefFunc *pRVar5;
  I31New *this_00;
  StringConst *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  long lVar8;
  Literal *other;
  Literal *pLVar9;
  char *__assertion;
  long lVar10;
  long lVar11;
  Name func;
  string_view sVar12;
  Literal local_b0;
  Literal local_98;
  undefined1 local_80 [8];
  value_type c;
  size_type *local_60;
  string string;
  Type local_38;
  Type type;
  
  type_00.id = (value->type).id;
  local_38.id = type_00.id;
  if (type_00.id - 2 < 5) {
    Literal::Literal(&local_b0,value);
    pCVar2 = makeConst(this,&local_b0);
    pLVar9 = &local_b0;
  }
  else {
    bVar1 = Literal::isNull(value);
    if (bVar1) {
      pEVar3 = (Expression *)makeRefNull(this,type_00);
      return pEVar3;
    }
    bVar1 = wasm::Type::isFunction(&local_38);
    if (bVar1) {
      func = Literal::getFunc(value);
      HVar4 = wasm::Type::getHeapType(&local_38);
      pRVar5 = makeRefFunc(this,func,HVar4);
      return (Expression *)pRVar5;
    }
    bVar1 = wasm::Type::isRef(&local_38);
    if ((bVar1) && (HVar4 = wasm::Type::getHeapType(&local_38), HVar4.id == 4)) {
      x = Literal::geti31(value,true);
      pCVar2 = makeConst<int>(this,x);
      this_00 = (I31New *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression._id = I31NewId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression.type.id = 0;
      this_00->value = (Expression *)pCVar2;
      I31New::finalize(this_00);
      return (Expression *)this_00;
    }
    bVar1 = wasm::Type::isString(&local_38);
    if (bVar1) {
      local_60 = &string._M_string_length;
      string._M_dataplus._M_p = (pointer)0x0;
      string._M_string_length._0_1_ = 0;
      Literal::getGCData((Literal *)local_80);
      string.field_2._8_8_ = local_80;
      c.type.id = (uintptr_t)this;
      if (c.field_0.i64 != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   c.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      lVar10 = (*(long *)(string.field_2._8_8_ + 0x30) - *(long *)(string.field_2._8_8_ + 0x28) >> 3
               ) * -0x5555555555555555 + *(long *)(string.field_2._8_8_ + 8);
      uVar7 = string.field_2._8_8_;
      if (lVar10 != 0) {
        pLVar9 = (Literal *)(string.field_2._8_8_ + 0x10);
        lVar8 = -0x18;
        lVar11 = 0;
        do {
          other = (Literal *)(*(long *)(string.field_2._8_8_ + 0x28) + lVar8);
          if (lVar11 == 0) {
            other = pLVar9;
          }
          Literal::Literal((Literal *)local_80,other);
          Literal::getInteger((Literal *)local_80);
          std::__cxx11::string::push_back((char)&local_60);
          Literal::~Literal((Literal *)local_80);
          lVar11 = lVar11 + 1;
          lVar8 = lVar8 + 0x18;
        } while (lVar10 != lVar11);
      }
      sVar12._M_str = (char *)0x0;
      sVar12._M_len = (size_t)local_60;
      sVar12 = IString::interned((IString *)string._M_dataplus._M_p,sVar12,SUB81(uVar7,0));
      this_01 = (StringConst *)
                MixedArena::allocSpace((MixedArena *)(*(long *)c.type.id + 0x158),0x20,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)74>).super_Expression._id =
           StringConstId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)74>).super_Expression.type.id = 0;
      (this_01->string).super_IString.str = sVar12;
      StringConst::finalize(this_01);
      if (local_60 == &string._M_string_length) {
        return (Expression *)this_01;
      }
      operator_delete(local_60,CONCAT71(string._M_string_length._1_7_,
                                        (undefined1)string._M_string_length) + 1);
      return (Expression *)this_01;
    }
    bVar1 = wasm::Type::isRef(&local_38);
    if ((!bVar1) || (HVar4 = wasm::Type::getHeapType(&local_38), HVar4.id != 0)) {
      bVar1 = wasm::Type::isTuple(&local_38);
      if (bVar1) {
        __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
      }
      else {
        if (local_38.id < 7) {
          handle_unreachable("unsupported constant expression",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                             ,0x4a7);
        }
        __assertion = "type.isBasic() && \"TODO: handle compound types\"";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                    ,0x4a6,"Expression *wasm::Builder::makeConstantExpression(Literal)");
    }
    Literal::internalize(&local_98,value);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)makeConstantExpression(this,&local_98);
    pCVar2 = (Const *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
    (pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = RefAsId;
    (pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
    (pCVar2->value).field_0.i32 = 2;
    (pCVar2->value).field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    RefAs::finalize((RefAs *)pCVar2);
    pLVar9 = &local_98;
  }
  Literal::~Literal(pLVar9);
  return (Expression *)pCVar2;
}

Assistant:

Expression* makeConstantExpression(Literal value) {
    auto type = value.type;
    if (type.isNumber()) {
      return makeConst(value);
    }
    if (value.isNull()) {
      return makeRefNull(type);
    }
    if (type.isFunction()) {
      return makeRefFunc(value.getFunc(), type.getHeapType());
    }
    if (type.isRef() && type.getHeapType() == HeapType::i31) {
      return makeI31New(makeConst(value.geti31()));
    }
    if (type.isString()) {
      // TODO: more than ascii support
      std::string string;
      for (auto c : value.getGCData()->values) {
        string.push_back(c.getInteger());
      }
      return makeStringConst(string);
    }
    if (type.isRef() && type.getHeapType() == HeapType::ext) {
      return makeRefAs(ExternExternalize,
                       makeConstantExpression(value.internalize()));
    }
    TODO_SINGLE_COMPOUND(type);
    WASM_UNREACHABLE("unsupported constant expression");
  }